

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneNamesImpl::ZoneStringsLoader::load(ZoneStringsLoader *this,UErrorCode *status)

{
  ZNamesLoader *this_00;
  UHashtable *pUVar1;
  UBool UVar2;
  UHashElement *pUVar3;
  UChar **ppUVar4;
  undefined1 local_c8 [8];
  UnicodeString tzID;
  undefined1 local_78 [8];
  UnicodeString mzID;
  char *key;
  ZNamesLoader *loader;
  UHashElement *element;
  UErrorCode *pUStack_18;
  int32_t pos;
  UErrorCode *status_local;
  ZoneStringsLoader *this_local;
  
  pUStack_18 = status;
  status_local = (UErrorCode *)this;
  ures_getAllItemsWithFallback_63(this->tzn->fZoneStrings,"",&this->super_ResourceSink,status);
  UVar2 = ::U_FAILURE(*pUStack_18);
  if (UVar2 == '\0') {
    element._4_4_ = 0xffffffff;
    do {
      do {
        pUVar3 = uhash_nextElement_63(this->keyToLoader,(int32_t *)((long)&element + 4));
        if (pUVar3 == (UHashElement *)0x0) {
          return;
        }
      } while ((char *)(pUVar3->value).pointer == "<dummy>");
      this_00 = (ZNamesLoader *)(pUVar3->value).pointer;
      mzID.fUnion._48_8_ = (pUVar3->key).pointer;
      UVar2 = isMetaZone(this,(char *)mzID.fUnion._48_8_);
      if (UVar2 == '\0') {
        tzIDFromKey((UnicodeString *)local_c8,this,(char *)mzID.fUnion._48_8_);
        pUVar1 = this->tzn->fTZNamesMap;
        ppUVar4 = ZNames::ZNamesLoader::getNames(this_00);
        ZNames::createTimeZoneAndPutInCache(pUVar1,ppUVar4,(UnicodeString *)local_c8,pUStack_18);
        UnicodeString::~UnicodeString((UnicodeString *)local_c8);
      }
      else {
        mzIDFromKey((UnicodeString *)local_78,this,(char *)mzID.fUnion._48_8_);
        pUVar1 = this->tzn->fMZNamesMap;
        ppUVar4 = ZNames::ZNamesLoader::getNames(this_00);
        ZNames::createMetaZoneAndPutInCache(pUVar1,ppUVar4,(UnicodeString *)local_78,pUStack_18);
        UnicodeString::~UnicodeString((UnicodeString *)local_78);
      }
      UVar2 = ::U_FAILURE(*pUStack_18);
    } while (UVar2 == '\0');
  }
  return;
}

Assistant:

void load(UErrorCode& status) {
        ures_getAllItemsWithFallback(tzn.fZoneStrings, "", *this, status);
        if (U_FAILURE(status)) { return; }

        int32_t pos = UHASH_FIRST;
        const UHashElement* element;
        while ((element = uhash_nextElement(keyToLoader, &pos)) != NULL) {
            if (element->value.pointer == DUMMY_LOADER) { continue; }
            ZNames::ZNamesLoader* loader = (ZNames::ZNamesLoader*) element->value.pointer;
            char* key = (char*) element->key.pointer;

            if (isMetaZone(key)) {
                UnicodeString mzID = mzIDFromKey(key);
                ZNames::createMetaZoneAndPutInCache(tzn.fMZNamesMap, loader->getNames(), mzID, status);
            } else {
                UnicodeString tzID = tzIDFromKey(key);
                ZNames::createTimeZoneAndPutInCache(tzn.fTZNamesMap, loader->getNames(), tzID, status);
            }
            if (U_FAILURE(status)) { return; }
        }
    }